

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

iterator __thiscall cmComputeLinkDepends::AllocateLinkEntry(cmComputeLinkDepends *this,string *item)

{
  size_type sVar1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  _Var2;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_int>_&>::value,_pair<iterator,_bool>_>
  _Var3;
  cmGraphEdgeList local_d8;
  value_type local_b8;
  LinkEntry local_b0;
  _Base_ptr local_80;
  undefined1 local_78;
  _Base_ptr local_60;
  undefined1 local_58;
  int local_4c;
  undefined1 local_48 [8];
  value_type index_entry;
  string *item_local;
  cmComputeLinkDepends *this_local;
  iterator lei;
  
  index_entry._32_8_ = item;
  sVar1 = std::
          vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          ::size(&this->EntryList);
  local_4c = (int)sVar1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<int,_true>((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                   *)local_48,item,&local_4c);
  _Var3 = std::
          map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::insert<std::pair<std::__cxx11::string_const,int>&>
                    ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&this->LinkEntryIndex,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)local_48);
  _Var2 = _Var3.first._M_node;
  local_78 = _Var3.second;
  local_80 = _Var2._M_node;
  local_60 = _Var2._M_node;
  local_58 = local_78;
  LinkEntry::LinkEntry(&local_b0);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  push_back(&this->EntryList,&local_b0);
  LinkEntry::~LinkEntry(&local_b0);
  local_b8 = (value_type)0x0;
  std::
  vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
  ::push_back(&this->InferredDependSets,&local_b8);
  local_d8.super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cmGraphEdgeList::cmGraphEdgeList(&local_d8);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::push_back
            (&(this->EntryConstraintGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,&local_d8);
  cmGraphEdgeList::~cmGraphEdgeList(&local_d8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)local_48);
  return (iterator)_Var2._M_node;
}

Assistant:

std::map<std::string, int>::iterator
cmComputeLinkDepends::AllocateLinkEntry(std::string const& item)
{
  std::map<std::string, int>::value_type
    index_entry(item, static_cast<int>(this->EntryList.size()));
  std::map<std::string, int>::iterator
    lei = this->LinkEntryIndex.insert(index_entry).first;
  this->EntryList.push_back(LinkEntry());
  this->InferredDependSets.push_back(0);
  this->EntryConstraintGraph.push_back(EdgeList());
  return lei;
}